

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O0

void __thiscall TextFile::bufPut(TextFile *this,void *p,size_t len)

{
  void *__dest;
  size_t len_local;
  void *p_local;
  TextFile *this_local;
  
  if (this->mode == Write) {
    if (len < 0x1001) {
      if (0x1000 < this->bufPos + len) {
        bufDrainWrite(this);
      }
      __dest = (void *)std::__cxx11::string::operator[]((ulong)&this->buf);
      memcpy(__dest,p,len);
      this->bufPos = len + this->bufPos;
    }
    else {
      bufDrainWrite(this);
      std::ostream::write(&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.
                           field_0x10,(long)p);
    }
    return;
  }
  __assert_fail("mode == Write",
                "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Util/FileClasses.cpp"
                ,0x38f,"void TextFile::bufPut(const void *, const size_t)");
}

Assistant:

void TextFile::bufPut(const void *p, const size_t len)
{
	assert(mode == Write);

	if (len > TEXTFILE_BUF_MAX_SIZE)
	{
		// Lots of data.  Let's write directly.
		bufDrainWrite();
		stream.write(reinterpret_cast<const char*>(p), len);
	}
	else
	{
		if (bufPos + len > TEXTFILE_BUF_MAX_SIZE)
			bufDrainWrite();

		memcpy(&buf[bufPos], p, len);
		bufPos += len;
	}
}